

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkexmlParser.cpp
# Opt level: O3

shared_ptr<Node> __thiscall SkexmlParser::MakeNode(SkexmlParser *this,string *name,ifstream *file)

{
  Node *pNVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Alloc_hider _Var9;
  ulong uVar10;
  bool bVar11;
  shared_ptr<Node> sVar12;
  string attribute_name;
  string input;
  string child_name;
  string value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  long local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  element_type *local_158;
  SkexmlParser *local_150;
  string local_148;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  element_type *local_108;
  string local_100;
  shared_ptr<Node> local_e0;
  string local_d0;
  string local_b0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  *(undefined8 *)this = 0;
  local_150 = this + 8;
  local_158 = (element_type *)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Node,std::allocator<Node>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_150,(Node **)this,
             (allocator<Node> *)&local_128,name);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
  cVar2 = (char)file;
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)file,(string *)&local_148,cVar3);
  Utils::RemoveEndline(&local_148);
  _Var8._M_pi = extraout_RDX;
LAB_001547d6:
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) != 0) {
LAB_00154c62:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
      _Var8._M_pi = extraout_RDX_10;
    }
    if (local_128 != local_118) {
      operator_delete(local_128);
      _Var8._M_pi = extraout_RDX_11;
    }
    sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
    sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_158;
    return (shared_ptr<Node>)sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  if (1 < local_148._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
    iVar4 = std::__cxx11::string::compare((char *)&local_178);
    _Var8._M_pi = extraout_RDX_00;
    if (local_178 != &local_168) {
      operator_delete(local_178);
      _Var8._M_pi = extraout_RDX_01;
    }
    if (iVar4 == 0) goto LAB_00154c62;
  }
  std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
  iVar4 = std::__cxx11::string::compare((char *)&local_178);
  _Var8._M_pi = extraout_RDX_02;
  if (local_178 != &local_168) {
    operator_delete(local_178);
    _Var8._M_pi = extraout_RDX_03;
  }
  if (iVar4 != 0) {
    do {
      if (local_148._M_string_length < 2) {
        uVar5 = *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x20);
        if ((uVar5 & 2) != 0) goto LAB_00154b21;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
        iVar4 = std::__cxx11::string::compare((char *)&local_178);
        if (iVar4 == 0) {
          bVar11 = false;
        }
        else {
          bVar11 = ((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) == 0;
        }
        _Var8._M_pi = extraout_RDX_04;
        if (local_178 != &local_168) {
          operator_delete(local_178);
          _Var8._M_pi = extraout_RDX_05;
        }
        if (!bVar11) goto LAB_00154b15;
      }
      pNVar1 = (local_158->_parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"List","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_148._M_dataplus._M_p,
                 local_148._M_dataplus._M_p + local_148._M_string_length);
      Node::AddListAttribute(pNVar1,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)file,(string *)&local_148,cVar3);
      Utils::RemoveEndline(&local_148);
      _Var8._M_pi = extraout_RDX_06;
    } while( true );
  }
  uVar10 = local_148._M_string_length - 1;
  uVar6 = std::__cxx11::string::find((char *)&local_148,0x170103,0);
  if (uVar6 < uVar10) {
    std::__cxx11::string::find((char *)&local_148,0x170103,0);
    std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
    std::__cxx11::string::find((char *)&local_148,0x170103,0);
    std::__cxx11::string::find((char *)&local_148,0x170105,0);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_148);
    local_108 = (local_158->_parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_178,local_178->_M_local_buf + local_170);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_90,local_90 + local_88);
    Node::AddAttribute(local_108,&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    paVar7 = &local_168;
    _Var9._M_p = (pointer)local_178;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_178);
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    pNVar1 = (local_158->_parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_128,local_128 + local_120);
    MakeNode((SkexmlParser *)&local_e0,&local_100,file);
    Node::AddChild(pNVar1,&local_e0);
    if (local_e0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    paVar7 = &local_100.field_2;
    _Var9._M_p = local_100._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != paVar7) {
    operator_delete(_Var9._M_p);
  }
  goto LAB_00154c33;
LAB_00154b15:
  uVar5 = *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x20);
LAB_00154b21:
  if ((uVar5 & 2) != 0) goto LAB_00154c62;
  if (1 < local_148._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_178,(ulong)&local_148);
    iVar4 = std::__cxx11::string::compare((char *)&local_178);
    _Var8._M_pi = extraout_RDX_07;
    if (local_178 != &local_168) {
      operator_delete(local_178);
      _Var8._M_pi = extraout_RDX_08;
    }
    if (iVar4 == 0) goto LAB_00154c62;
  }
LAB_00154c33:
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)file,(string *)&local_148,cVar3);
  Utils::RemoveEndline(&local_148);
  _Var8._M_pi = extraout_RDX_09;
  goto LAB_001547d6;
}

Assistant:

std::shared_ptr<Node> SkexmlParser::MakeNode(std::string name, std::ifstream& file) {
    std::shared_ptr<Node> node = std::make_shared<Node>(name);
    std::string child_name = "";
    std::string input = "";
    std::getline(file, input);
    Utils::RemoveEndline(input);
    while(!file.eof())
    {
        if(input.length() > 1 and input.substr(0,2) == "[/")
            return node;
        else if(input.substr(0,1) != "[") {
            while((input.length() < 2 or input.substr(0,2) != "[/") and !file.eof())
            {
                node->AddListAttribute("List", input);
                std::getline(file, input);
                Utils::RemoveEndline(input);
            }
            if(file.eof() or (input.length() > 1 and input.substr(0,2) == "[/"))
                return node;
        }
        else if(input.length() - 1 > input.find("]")) {
            std::string attribute_name = input.substr(1, input.find("]") - 1);
            unsigned long value_begin = input.find("]") + 1;
            unsigned long value_end = input.find("[/") - value_begin;
            std::string value = input.substr(value_begin, value_end);
            node->AddAttribute(attribute_name, value);
        }
        else {
            child_name = input.substr(1, input.length() - 2);
            node->AddChild(MakeNode(child_name, file));
        }
        std::getline(file, input);
        Utils::RemoveEndline(input);
    }
    return node;
}